

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O2

int stmm_find_or_add(stmm_table *table,char *key,char ***slot)

{
  stmm_hash_func_type p_Var1;
  stmm_compare_func_type p_Var2;
  int iVar3;
  stmm_table_entry *psVar4;
  stmm_table_entry **ppsVar5;
  int iVar6;
  int local_48;
  
  p_Var1 = table->hash;
  iVar6 = (int)key;
  if (p_Var1 == stmm_ptrhash) {
    local_48 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
  }
  else if (p_Var1 == stmm_numhash) {
    local_48 = -iVar6;
    if (0 < iVar6) {
      local_48 = iVar6;
    }
    local_48 = local_48 % table->num_bins;
  }
  else {
    local_48 = (*p_Var1)(key,table->num_bins);
  }
  ppsVar5 = table->bins + local_48;
  do {
    psVar4 = *ppsVar5;
    if (psVar4 == (stmm_table_entry *)0x0) {
      if (table->max_density <= table->num_entries / table->num_bins) {
        iVar3 = rehash(table);
        if (iVar3 == -10000) {
          return -10000;
        }
        p_Var1 = table->hash;
        if (p_Var1 == stmm_ptrhash) {
          local_48 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
        }
        else if (p_Var1 == stmm_numhash) {
          local_48 = -iVar6;
          if (0 < iVar6) {
            local_48 = iVar6;
          }
          local_48 = local_48 % table->num_bins;
        }
        else {
          local_48 = (*p_Var1)(key,table->num_bins);
        }
      }
      psVar4 = (stmm_table_entry *)Extra_MmFixedEntryFetch((Extra_MmFixed_t *)table->pMemMan);
      if (psVar4 == (stmm_table_entry *)0x0) {
        iVar3 = -10000;
      }
      else {
        psVar4->key = key;
        psVar4->record = (char *)0x0;
        ppsVar5 = table->bins;
        psVar4->next = ppsVar5[local_48];
        ppsVar5[local_48] = psVar4;
        table->num_entries = table->num_entries + 1;
        iVar3 = 0;
        iVar6 = 0;
        if (slot != (char ***)0x0) {
LAB_003df441:
          iVar3 = iVar6;
          *slot = &psVar4->record;
        }
      }
      return iVar3;
    }
    p_Var2 = table->compare;
    if (p_Var2 == stmm_numcmp || p_Var2 == stmm_ptrcmp) {
      if (psVar4->key == key) {
LAB_003df3a1:
        if (table->reorder_flag != 0) {
          *ppsVar5 = psVar4->next;
          ppsVar5 = table->bins;
          psVar4->next = ppsVar5[local_48];
          ppsVar5[local_48] = psVar4;
        }
        if (slot == (char ***)0x0) {
          return 1;
        }
        iVar6 = 1;
        goto LAB_003df441;
      }
    }
    else {
      iVar3 = (*p_Var2)(key,psVar4->key);
      if (iVar3 == 0) goto LAB_003df3a1;
    }
    ppsVar5 = &psVar4->next;
  } while( true );
}

Assistant:

int
stmm_find_or_add (stmm_table *table, char *key, char ***slot)
{
    int hash_val;
    stmm_table_entry *newEntry, *ptr, **last;

    hash_val = do_hash (key, table);

    FIND_ENTRY (table, hash_val, key, ptr, last);

    if (ptr == NULL) {
    if (table->num_entries / table->num_bins >= table->max_density) {
        if (rehash (table) == STMM_OUT_OF_MEM) {
        return STMM_OUT_OF_MEM;
        }
        hash_val = do_hash (key, table);
    }

    // newEntry = ABC_ALLOC( stmm_table_entry, 1 );
    newEntry = (stmm_table_entry *) Extra_MmFixedEntryFetch ((Extra_MmFixed_t *)table->pMemMan);
    if (newEntry == NULL) {
        return STMM_OUT_OF_MEM;
    }

    newEntry->key = key;
    newEntry->record = (char *) 0;
    newEntry->next = table->bins[hash_val];
    table->bins[hash_val] = newEntry;
    table->num_entries++;
    if (slot != NULL)
         *slot = &newEntry->record;
    return 0;
    }
    else {
    if (slot != NULL)
         *slot = &ptr->record;
    return 1;
    }
}